

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O2

void glu::sl::dumpValues(TestLog *log,
                        vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *values,
                        char *storageName,int arrayNdx)

{
  float fVar1;
  DataType dataType;
  pointer pVVar2;
  _Alloc_hider _Var3;
  long lVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ostream *poVar8;
  char *pcVar9;
  long lVar10;
  int colNdx;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int elemNdx;
  string local_348 [32];
  ostringstream result;
  MessageBuilder local_1b0;
  
  uVar12 = 0;
  do {
    pVVar2 = (values->super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(values->super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>)
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2) / 0x50) <= uVar12)
    {
      return;
    }
    _Var3._M_p = pVVar2[uVar12].name._M_dataplus._M_p;
    dataType = pVVar2[uVar12].type.m_data.basic.type;
    uVar14 = (ulong)dataType;
    uVar5 = getDataTypeScalarSize(dataType);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&result);
    poVar8 = std::operator<<((ostream *)&result,"    ");
    poVar8 = std::operator<<(poVar8,storageName);
    std::operator<<(poVar8," ");
    pcVar9 = getDataTypeName(dataType);
    poVar8 = std::operator<<((ostream *)&result,pcVar9);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = std::operator<<(poVar8,_Var3._M_p);
    std::operator<<(poVar8,":");
    if (dataType < TYPE_BOOL_VEC2) {
      pcVar9 = " [ ";
      if ((0x77003801cU >> (uVar14 & 0x3f) & 1) == 0) {
        if ((0x888004002U >> (uVar14 & 0x3f) & 1) == 0) goto LAB_008f4f57;
        std::operator<<((ostream *)&result," ");
        if ((dataType < TYPE_BOOL) && (pcVar9 = " [ ", (0x77003801cU >> (uVar14 & 0x3f) & 1) != 0))
        goto LAB_008f4c8a;
        goto LAB_008f4f6f;
      }
LAB_008f4c8a:
      std::operator<<((ostream *)&result,pcVar9);
    }
    else {
LAB_008f4f57:
      pcVar9 = " [ ";
      if (dataType - TYPE_BOOL_VEC2 < 3) goto LAB_008f4c8a;
LAB_008f4f6f:
      pcVar9 = "\n";
      if (dataType - TYPE_FLOAT_MAT2 < 9 || dataType - TYPE_DOUBLE_MAT2 < 9) goto LAB_008f4c8a;
    }
    if (((dataType < TYPE_BOOL) && ((0x7f803c01eU >> (uVar14 & 0x3f) & 1) != 0)) ||
       (dataType - TYPE_BOOL < 4)) {
      uVar7 = uVar5;
      if ((int)uVar5 < 1) {
        uVar7 = 0;
      }
      for (uVar14 = 0; uVar7 != uVar14; uVar14 = uVar14 + 1) {
        lVar4 = *(long *)&pVVar2[uVar12].elements.
                          super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                          ._M_impl.super__Vector_impl_data;
        pcVar9 = ", ";
        if (uVar14 == 0) {
          pcVar9 = "";
        }
        std::operator<<((ostream *)&result,pcVar9);
        lVar10 = (long)(int)(uVar5 * arrayNdx + (int)uVar14);
        if (dataType - TYPE_FLOAT < 4) {
          std::ostream::operator<<(&result,*(float *)(lVar4 + lVar10 * 4));
        }
        else if (dataType - TYPE_INT < 4) {
          std::ostream::operator<<(&result,*(int *)(lVar4 + lVar10 * 4));
        }
        else if (dataType - TYPE_UINT < 4) {
          std::ostream::_M_insert<unsigned_long>((ulong)&result);
        }
        else if (dataType - TYPE_BOOL < 4) {
          pcVar9 = "true";
          if (*(int *)(lVar4 + lVar10 * 4) == 0) {
            pcVar9 = "false";
          }
          std::operator<<((ostream *)&result,pcVar9);
        }
      }
    }
    else if (dataType - TYPE_FLOAT_MAT2 < 9 || dataType - TYPE_DOUBLE_MAT2 < 9) {
      iVar6 = getDataTypeMatrixNumRows(dataType);
      uVar7 = getDataTypeMatrixNumColumns(dataType);
      iVar13 = uVar5 * arrayNdx;
      iVar15 = 0;
      uVar14 = 0;
      if (0 < (int)uVar7) {
        uVar14 = (ulong)uVar7;
      }
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      for (; iVar15 != iVar6; iVar15 = iVar15 + 1) {
        std::operator<<((ostream *)&result,"       [ ");
        for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
          fVar1 = *(float *)(*(long *)&pVVar2[uVar12].elements.
                                       super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                                       ._M_impl.super__Vector_impl_data +
                            (long)((int)uVar11 + iVar13) * 4);
          pcVar9 = ", ";
          if (uVar11 == 0) {
            pcVar9 = "";
          }
          poVar8 = std::operator<<((ostream *)&result,pcVar9);
          std::ostream::operator<<(poVar8,fVar1);
        }
        std::operator<<((ostream *)&result," ]\n");
        iVar13 = iVar13 + uVar7;
      }
    }
    uVar5 = dataType - TYPE_FLOAT;
    if ((uVar5 < 0x23) && ((0x7fc01e00fU >> ((ulong)uVar5 & 0x3f) & 1) != 0)) {
      pcVar9 = &DAT_00a3d4d8 + *(int *)(&DAT_00a3d4d8 + (ulong)uVar5 * 4);
LAB_008f4ed6:
      std::operator<<((ostream *)&result,pcVar9);
    }
    else {
      pcVar9 = " ]\n";
      if (dataType - TYPE_BOOL_VEC2 < 3) goto LAB_008f4ed6;
    }
    local_1b0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)&local_1b0.m_str,local_348);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string(local_348);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&result);
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

static void dumpValues (tcu::TestLog& log, const vector<Value>& values, const char* storageName, int arrayNdx)
{
	for (size_t valNdx = 0; valNdx < values.size(); valNdx++)
		dumpValue(log, values[valNdx], storageName, arrayNdx);
}